

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O0

void anon_unknown.dwarf_604d5::test_parts<Imath_3_2::half>
               (int pattern_number,int number_of_parts,bool load_depths,bool entire_buffer,
               string *tempDir)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  char *pcVar4;
  DeepScanLineInputPart *this;
  reference ppDVar5;
  long lVar6;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *this_00;
  data<Imath_3_2::half> *pdVar7;
  byte in_CL;
  byte in_DL;
  int in_ESI;
  int high_1;
  int low_1;
  Box2i *dataWindow;
  FrameBuffer testbuf_1;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> data_1;
  InputFile file;
  int i_1;
  int high;
  int low;
  int i;
  vector<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_> parts;
  MultiPartInputFile input;
  FrameBuffer testbuf;
  CompositeDeepScanLine comp;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> data;
  data<Imath_3_2::half> main;
  string fn;
  data<Imath_3_2::half> *in_stack_fffffffffffffd60;
  allocator_type *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  vector<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>
  *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  int local_1e8;
  int local_1e4;
  undefined1 in_stack_fffffffffffffe47;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  Box2i *in_stack_fffffffffffffe50;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *in_stack_fffffffffffffe58;
  data<Imath_3_2::half> *in_stack_fffffffffffffe60;
  undefined1 local_190 [64];
  MultiPartInputFile local_150 [64];
  FrameBuffer local_110 [2];
  int in_stack_ffffffffffffff7c;
  data<Imath_3_2::half> *in_stack_ffffffffffffff80;
  string local_38 [46];
  byte local_a;
  byte local_9;
  int local_8;
  
  local_9 = in_DL & 1;
  local_a = in_CL & 1;
  local_8 = in_ESI;
  std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
  data<Imath_3_2::half>::data(in_stack_fffffffffffffd60);
  make_pattern<Imath_3_2::half>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  std::__cxx11::string::c_str();
  write_file<Imath_3_2::half>
            ((char *)testbuf_1._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
             (data<Imath_3_2::half> *)
             testbuf_1._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             testbuf_1._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_);
  std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::vector
            ((vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *)0x1489d8);
  Imf_3_2::CompositeDeepScanLine::CompositeDeepScanLine((CompositeDeepScanLine *)local_110);
  Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x1489f4);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_150,pcVar4,iVar3,true);
  std::allocator<Imf_3_2::DeepScanLineInputPart_*>::allocator
            ((allocator<Imf_3_2::DeepScanLineInputPart_*> *)0x148a5f);
  std::vector<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>::
  vector(in_stack_fffffffffffffd80,CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
         in_stack_fffffffffffffd70);
  std::allocator<Imf_3_2::DeepScanLineInputPart_*>::~allocator
            ((allocator<Imf_3_2::DeepScanLineInputPart_*> *)0x148a8b);
  for (local_190._32_4_ = 0; (int)local_190._32_4_ < local_8;
      local_190._32_4_ = local_190._32_4_ + 1) {
    this = (DeepScanLineInputPart *)operator_new(8);
    Imf_3_2::DeepScanLineInputPart::DeepScanLineInputPart(this,local_150,local_190._32_4_);
    ppDVar5 = std::
              vector<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>
              ::operator[]((vector<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>
                            *)(local_190 + 0x28),(long)(int)local_190._32_4_);
    *ppDVar5 = this;
    std::vector<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>
    ::operator[]((vector<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>
                  *)(local_190 + 0x28),(long)(int)local_190._32_4_);
    Imf_3_2::CompositeDeepScanLine::addSource((DeepScanLineInputPart *)local_110);
  }
  Imf_3_2::CompositeDeepScanLine::dataWindow();
  data<Imath_3_2::half>::setUpFrameBuffer
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (FrameBuffer *)in_stack_fffffffffffffe50,
             (Box2i *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
             (bool)in_stack_fffffffffffffe47);
  Imf_3_2::CompositeDeepScanLine::setFrameBuffer(local_110);
  if ((local_a & 1) == 0) {
    lVar6 = Imf_3_2::CompositeDeepScanLine::dataWindow();
    local_190._28_4_ = *(int *)(lVar6 + 4);
    while (uVar1 = local_190._28_4_, lVar6 = Imf_3_2::CompositeDeepScanLine::dataWindow(),
          uVar2 = local_190._28_4_, (int)uVar1 < *(int *)(lVar6 + 0xc)) {
      iVar3 = random_int((int)((ulong)in_stack_fffffffffffffd60 >> 0x20));
      local_190._24_4_ = uVar2 + iVar3;
      lVar6 = Imf_3_2::CompositeDeepScanLine::dataWindow();
      if (*(int *)(lVar6 + 0xc) < uVar2 + iVar3) {
        lVar6 = Imf_3_2::CompositeDeepScanLine::dataWindow();
        local_190._24_4_ = *(int *)(lVar6 + 0xc);
      }
      Imf_3_2::CompositeDeepScanLine::readPixels((int)local_110,local_190._28_4_);
      local_190._28_4_ = local_190._24_4_;
    }
  }
  else {
    lVar6 = Imf_3_2::CompositeDeepScanLine::dataWindow();
    iVar3 = *(int *)(lVar6 + 4);
    Imf_3_2::CompositeDeepScanLine::dataWindow();
    Imf_3_2::CompositeDeepScanLine::readPixels((int)local_110,iVar3);
  }
  Imf_3_2::CompositeDeepScanLine::dataWindow();
  data<Imath_3_2::half>::checkValues
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
             (bool)in_stack_fffffffffffffe4f);
  for (local_190._20_4_ = 0; (int)local_190._20_4_ < local_8;
      local_190._20_4_ = local_190._20_4_ + 1) {
    ppDVar5 = std::
              vector<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>
              ::operator[]((vector<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>
                            *)(local_190 + 0x28),(long)(int)local_190._20_4_);
    if (*ppDVar5 != (value_type)0x0) {
      operator_delete(*ppDVar5,8);
    }
  }
  std::vector<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>::
  ~vector((vector<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>
           *)in_stack_fffffffffffffd70);
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile(local_150);
  Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x148e9d);
  Imf_3_2::CompositeDeepScanLine::~CompositeDeepScanLine((CompositeDeepScanLine *)local_110);
  std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::~vector
            ((vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *)in_stack_fffffffffffffd70)
  ;
  if (local_8 == 1) {
    this_00 = (vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *)
              std::__cxx11::string::c_str();
    iVar3 = Imf_3_2::globalThreadCount();
    Imf_3_2::InputFile::InputFile((InputFile *)local_190,(char *)this_00,iVar3);
    std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::vector
              ((vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *)0x148f07);
    Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x148f14);
    Imf_3_2::InputFile::header();
    pdVar7 = (data<Imath_3_2::half> *)Imf_3_2::Header::dataWindow();
    in_stack_fffffffffffffd60 = pdVar7;
    data<Imath_3_2::half>::setUpFrameBuffer
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (FrameBuffer *)in_stack_fffffffffffffe50,
               (Box2i *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
               (bool)in_stack_fffffffffffffe47);
    Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)local_190);
    if ((local_a & 1) == 0) {
      local_1e4 = *(int *)((long)&(pdVar7->_channels).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 4);
      while (local_1e4 <
             *(int *)((long)&(pdVar7->_channels).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 4)) {
        local_1e8 = random_int((int)((ulong)in_stack_fffffffffffffd60 >> 0x20));
        local_1e8 = local_1e4 + local_1e8;
        if (*(int *)((long)&(pdVar7->_channels).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 4) < local_1e8) {
          local_1e8 = *(int *)((long)&(pdVar7->_channels).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + 4);
        }
        Imf_3_2::InputFile::readPixels((int)local_190,local_1e4);
        local_1e4 = local_1e8;
      }
    }
    else {
      Imf_3_2::InputFile::readPixels
                ((int)local_190,
                 *(int *)((long)&(pdVar7->_channels).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 4));
    }
    data<Imath_3_2::half>::checkValues
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
               (bool)in_stack_fffffffffffffe4f);
    Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x14912a);
    std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::~vector(this_00);
    Imf_3_2::InputFile::~InputFile((InputFile *)local_190);
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  remove(pcVar4);
  data<Imath_3_2::half>::~data(in_stack_fffffffffffffd60);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void
test_parts (
    int                pattern_number,
    int                number_of_parts,
    bool               load_depths,
    bool               entire_buffer,
    const std::string& tempDir)
{
    std::string fn = tempDir + "imf_test_composite_deep_scanline_source.exr";

    data<T> main;
    make_pattern (main, pattern_number);
    write_file (fn.c_str (), main, number_of_parts);

    {
        vector<T>                      data;
        CompositeDeepScanLine          comp;
        FrameBuffer                    testbuf;
        MultiPartInputFile             input (fn.c_str ());
        vector<DeepScanLineInputPart*> parts (number_of_parts);

        // use 'part' interface TODO test file interface too
        for (int i = 0; i < number_of_parts; i++)
        {
            parts[i] = new DeepScanLineInputPart (input, i);
            comp.addSource (parts[i]);
        }

        main.setUpFrameBuffer (
            data, testbuf, comp.dataWindow (), load_depths);

        comp.setFrameBuffer (testbuf);

        //
        // try loading the whole buffer
        //
        if (entire_buffer)
        {
            comp.readPixels (
                comp.dataWindow ().min.y, comp.dataWindow ().max.y);
        }
        else
        {
            int low = comp.dataWindow ().min.y;
            while (low < comp.dataWindow ().max.y)
            {
                int high = low + random_int (64);
                if (high > comp.dataWindow ().max.y)
                    high = comp.dataWindow ().max.y;
                comp.readPixels (low, high);
                low = high;
            }
        }

        main.checkValues (data, comp.dataWindow (), load_depths);

        for (int i = 0; i < number_of_parts; i++)
        {
            delete parts[i];
        }
    }
    if (number_of_parts == 1)
    {
        // also test InputFile interface
        InputFile    file (fn.c_str ());
        vector<T>    data;
        FrameBuffer  testbuf;
        const Box2i& dataWindow = file.header ().dataWindow ();
        main.setUpFrameBuffer (data, testbuf, dataWindow, load_depths);
        file.setFrameBuffer (testbuf);
        if (entire_buffer)
        {
            file.readPixels (dataWindow.min.y, dataWindow.max.y);
        }
        else
        {
            int low = dataWindow.min.y;
            while (low < dataWindow.max.y)
            {
                int high = low + random_int (64);
                if (high > dataWindow.max.y) high = dataWindow.max.y;
                file.readPixels (low, high);
                low = high;
            }
        }

        main.checkValues (data, dataWindow, load_depths);
    }
    remove (fn.c_str ());
}